

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O0

Path * __thiscall
RuntimeObjectSystem::FindFile
          (Path *__return_storage_ptr__,RuntimeObjectSystem *this,Path *input,bool *pFound)

{
  ICompilerLogger *pIVar1;
  byte bVar2;
  undefined8 uVar3;
  bool bVar4;
  long lVar5;
  char *pcVar6;
  size_type sVar7;
  string *psVar8;
  pointer ppVar9;
  size_type sVar10;
  reference this_00;
  mapped_type *pmVar11;
  char *pcVar12;
  bool bVar13;
  undefined1 local_408 [7];
  bool bFound;
  int local_3dc;
  Path local_3d8;
  undefined1 local_3b0 [8];
  Path directory_1;
  undefined1 local_360 [8];
  Path toCheck;
  size_t i;
  Path existingPath;
  _Self local_300;
  TFileMapIterator itr;
  undefined1 local_2d0 [8];
  Path requestedSubPath;
  TFileList requestedSubPaths;
  Path local_268;
  undefined1 local_240 [8];
  Path directory;
  _Self local_1f0;
  _Self local_1e8;
  TFileMapIterator itrFind;
  undefined1 local_1d8 [3];
  bool bFound_1;
  uint depth;
  Path foundDir;
  Path testDir;
  undefined1 local_180 [7];
  bool bFoundMapping;
  Path local_158;
  Path local_130;
  undefined1 local_108 [8];
  Path checkFromCurrentDir;
  Path local_b8;
  undefined1 local_8e;
  undefined1 local_8d;
  bool bIsFile;
  undefined1 local_80 [8];
  Path filename;
  Path requestedDirectory;
  bool bMaybeRelative;
  bool *pFound_local;
  Path *input_local;
  RuntimeObjectSystem *this_local;
  Path *foundFile;
  
  bVar13 = true;
  lVar5 = std::__cxx11::string::size();
  if (lVar5 != 0) {
    pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)&input->m_string);
    bVar13 = *pcVar6 != '/';
  }
  FileSystemUtils::Path::Path((Path *)((long)&filename.m_string.field_2 + 8),input);
  FileSystemUtils::Path::Path((Path *)local_80);
  local_8d = 0;
  FileSystemUtils::Path::Path(__return_storage_ptr__,input);
  local_8e = FileSystemUtils::Path::HasExtension(input);
  if ((bool)local_8e) {
    FileSystemUtils::Path::ParentPath(&local_b8,(Path *)((long)&filename.m_string.field_2 + 8));
    FileSystemUtils::Path::operator=((Path *)((long)&filename.m_string.field_2 + 8),&local_b8);
    FileSystemUtils::Path::~Path(&local_b8);
    FileSystemUtils::Path::Filename((Path *)((long)&checkFromCurrentDir.m_string.field_2 + 8),input)
    ;
    FileSystemUtils::Path::operator=
              ((Path *)local_80,(Path *)((long)&checkFromCurrentDir.m_string.field_2 + 8));
    FileSystemUtils::Path::~Path((Path *)((long)&checkFromCurrentDir.m_string.field_2 + 8));
  }
  if (bVar13) {
    FileSystemUtils::GetCurrentPath();
    FileSystemUtils::operator/((Path *)local_108,&local_130,input);
    FileSystemUtils::Path::~Path(&local_130);
    bVar13 = FileSystemUtils::Path::Exists((Path *)local_108);
    if (bVar13) {
      FileSystemUtils::Path::operator=(__return_storage_ptr__,(Path *)local_108);
      FileSystemUtils::GetCurrentPath();
      FileSystemUtils::operator/
                (&local_158,(Path *)local_180,(Path *)((long)&filename.m_string.field_2 + 8));
      FileSystemUtils::Path::operator=((Path *)((long)&filename.m_string.field_2 + 8),&local_158);
      FileSystemUtils::Path::~Path(&local_158);
      FileSystemUtils::Path::~Path((Path *)local_180);
    }
    FileSystemUtils::Path::~Path((Path *)local_108);
  }
  FileSystemUtils::Path::ToOSCanonicalCase((Path *)((long)&filename.m_string.field_2 + 8));
  FileSystemUtils::Path::ToOSCanonicalCase((Path *)local_80);
  FileSystemUtils::Path::ToOSCanonicalCase(__return_storage_ptr__);
  bVar13 = FileSystemUtils::Path::Exists((Path *)((long)&filename.m_string.field_2 + 8));
  if (bVar13) {
    pmVar11 = std::
              map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
              ::operator[](&this->m_FoundSourceDirectoryMappings,
                           (key_type *)((long)&filename.m_string.field_2 + 8));
    FileSystemUtils::Path::operator=(pmVar11,(Path *)((long)&filename.m_string.field_2 + 8));
  }
  else {
    bVar13 = false;
    sVar7 = std::
            map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
            ::size(&this->m_FoundSourceDirectoryMappings);
    if (sVar7 != 0) {
      FileSystemUtils::Path::Path
                ((Path *)((long)&foundDir.m_string.field_2 + 8),
                 (Path *)((long)&filename.m_string.field_2 + 8));
      FileSystemUtils::Path::Path((Path *)local_1d8);
      itrFind._M_node._4_4_ = 0;
      itrFind._M_node._3_1_ = 0;
      while (bVar4 = FileSystemUtils::Path::HasParentPath
                               ((Path *)((long)&foundDir.m_string.field_2 + 8)), bVar4) {
        local_1e8._M_node =
             (_Base_ptr)
             std::
             map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
             ::find(&this->m_FoundSourceDirectoryMappings,
                    (key_type *)((long)&foundDir.m_string.field_2 + 8));
        local_1f0._M_node =
             (_Base_ptr)
             std::
             map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
             ::end(&this->m_FoundSourceDirectoryMappings);
        bVar4 = std::operator!=(&local_1e8,&local_1f0);
        if (bVar4) {
          ppVar9 = std::
                   _Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>
                   ::operator->(&local_1e8);
          FileSystemUtils::Path::operator=((Path *)local_1d8,&ppVar9->second);
          itrFind._M_node._3_1_ = 1;
          break;
        }
        FileSystemUtils::Path::ParentPath
                  ((Path *)((long)&directory.m_string.field_2 + 8),
                   (Path *)((long)&foundDir.m_string.field_2 + 8));
        FileSystemUtils::Path::operator=
                  ((Path *)((long)&foundDir.m_string.field_2 + 8),
                   (Path *)((long)&directory.m_string.field_2 + 8));
        FileSystemUtils::Path::~Path((Path *)((long)&directory.m_string.field_2 + 8));
        itrFind._M_node._4_4_ = itrFind._M_node._4_4_ + 1;
      }
      if ((itrFind._M_node._3_1_ & 1) != 0) {
        if (itrFind._M_node._4_4_ == 0) {
          FileSystemUtils::operator/
                    ((Path *)&requestedSubPaths.
                              super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Path *)local_1d8,
                     (Path *)local_80);
          FileSystemUtils::Path::operator=
                    (__return_storage_ptr__,
                     (Path *)&requestedSubPaths.
                              super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          FileSystemUtils::Path::~Path
                    ((Path *)&requestedSubPaths.
                              super__Vector_base<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          bVar13 = true;
        }
        else {
          FileSystemUtils::Path::Path
                    ((Path *)local_240,(Path *)((long)&filename.m_string.field_2 + 8));
          psVar8 = (string *)std::__cxx11::string::length();
          std::__cxx11::string::replace((ulong)&directory,0,psVar8);
          bVar4 = FileSystemUtils::Path::Exists((Path *)local_240);
          if (bVar4) {
            FileSystemUtils::operator/(&local_268,(Path *)local_240,(Path *)local_80);
            FileSystemUtils::Path::operator=(__return_storage_ptr__,&local_268);
            FileSystemUtils::Path::~Path(&local_268);
            bVar4 = FileSystemUtils::Path::Exists(__return_storage_ptr__);
            if (bVar4) {
              pmVar11 = std::
                        map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                        ::operator[](&this->m_FoundSourceDirectoryMappings,
                                     (key_type *)((long)&filename.m_string.field_2 + 8));
              FileSystemUtils::Path::operator=(pmVar11,(Path *)local_240);
              if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
                pIVar1 = this->m_pCompilerLogger;
                pcVar6 = FileSystemUtils::Path::c_str
                                   ((Path *)((long)&filename.m_string.field_2 + 8));
                pcVar12 = FileSystemUtils::Path::c_str((Path *)local_240);
                (**(code **)(*(long *)pIVar1 + 0x10))
                          (pIVar1,"Found Directory Mapping: %s to %s\n",pcVar6,pcVar12);
              }
              bVar13 = true;
            }
          }
          FileSystemUtils::Path::~Path((Path *)local_240);
        }
      }
      if (!bVar13) {
        std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::vector
                  ((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> *)
                   ((long)&requestedSubPath.m_string.field_2 + 8));
        FileSystemUtils::Path::Path
                  ((Path *)local_2d0,(Path *)((long)&filename.m_string.field_2 + 8));
        while (bVar13 = FileSystemUtils::Path::HasParentPath((Path *)local_2d0), bVar13) {
          std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::push_back
                    ((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> *)
                     ((long)&requestedSubPath.m_string.field_2 + 8),(value_type *)local_2d0);
          FileSystemUtils::Path::ParentPath((Path *)&itr,(Path *)local_2d0);
          FileSystemUtils::Path::operator=((Path *)local_2d0,(Path *)&itr);
          FileSystemUtils::Path::~Path((Path *)&itr);
        }
        local_300._M_node =
             (_Base_ptr)
             std::
             map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
             ::begin(&this->m_FoundSourceDirectoryMappings);
        bVar2 = 0;
        while( true ) {
          existingPath.m_string.field_2._8_8_ =
               std::
               map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
               ::end(&this->m_FoundSourceDirectoryMappings);
          bVar4 = std::operator!=(&local_300,(_Self *)((long)&existingPath.m_string.field_2 + 8));
          bVar13 = false;
          if (bVar4) {
            bVar13 = (bool)(bVar2 ^ 1);
          }
          if (!bVar13) break;
          ppVar9 = std::
                   _Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>
                   ::operator->(&local_300);
          FileSystemUtils::Path::Path((Path *)&i,&ppVar9->second);
          while( true ) {
            bVar4 = FileSystemUtils::Path::HasParentPath((Path *)&i);
            bVar13 = false;
            if (bVar4) {
              bVar13 = (bool)(bVar2 ^ 1);
            }
            if (!bVar13) break;
            for (toCheck.m_string.field_2._8_8_ = 0; uVar3 = toCheck.m_string.field_2._8_8_,
                sVar10 = std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                         ::size((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                 *)((long)&requestedSubPath.m_string.field_2 + 8)),
                (ulong)uVar3 < sVar10;
                toCheck.m_string.field_2._8_8_ = toCheck.m_string.field_2._8_8_ + 1) {
              this_00 = std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::
                        operator[]((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>
                                    *)((long)&requestedSubPath.m_string.field_2 + 8),
                                   toCheck.m_string.field_2._8_8_);
              FileSystemUtils::Path::Filename
                        ((Path *)((long)&directory_1.m_string.field_2 + 8),this_00);
              FileSystemUtils::operator/
                        ((Path *)local_360,(Path *)&i,
                         (Path *)((long)&directory_1.m_string.field_2 + 8));
              FileSystemUtils::Path::~Path((Path *)((long)&directory_1.m_string.field_2 + 8));
              bVar13 = FileSystemUtils::Path::Exists((Path *)local_360);
              if (bVar13) {
                FileSystemUtils::Path::Path
                          ((Path *)local_3b0,(Path *)((long)&filename.m_string.field_2 + 8));
                std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::
                operator[]((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> *)
                           ((long)&requestedSubPath.m_string.field_2 + 8),
                           toCheck.m_string.field_2._8_8_);
                psVar8 = (string *)std::__cxx11::string::length();
                std::__cxx11::string::replace((ulong)&directory_1,0,psVar8);
                bVar13 = FileSystemUtils::Path::Exists((Path *)local_3b0);
                if (bVar13) {
                  FileSystemUtils::operator/(&local_3d8,(Path *)local_3b0,(Path *)local_80);
                  FileSystemUtils::Path::operator=(__return_storage_ptr__,&local_3d8);
                  FileSystemUtils::Path::~Path(&local_3d8);
                  bVar13 = FileSystemUtils::Path::Exists(__return_storage_ptr__);
                  if (!bVar13) goto LAB_001281a2;
                  pmVar11 = std::
                            map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
                            ::operator[](&this->m_FoundSourceDirectoryMappings,
                                         (key_type *)((long)&filename.m_string.field_2 + 8));
                  FileSystemUtils::Path::operator=(pmVar11,(Path *)local_3b0);
                  if (this->m_pCompilerLogger != (ICompilerLogger *)0x0) {
                    pIVar1 = this->m_pCompilerLogger;
                    pcVar6 = FileSystemUtils::Path::c_str
                                       ((Path *)((long)&filename.m_string.field_2 + 8));
                    pcVar12 = FileSystemUtils::Path::c_str((Path *)local_3b0);
                    (**(code **)(*(long *)pIVar1 + 0x10))
                              (pIVar1,"Found Directory Mapping: %s to %s\n",pcVar6,pcVar12);
                  }
                  bVar2 = 1;
                  local_3dc = 10;
                }
                else {
LAB_001281a2:
                  local_3dc = 0;
                }
                FileSystemUtils::Path::~Path((Path *)local_3b0);
                if (local_3dc == 0) goto LAB_001281d4;
              }
              else {
LAB_001281d4:
                local_3dc = 0;
              }
              FileSystemUtils::Path::~Path((Path *)local_360);
              if (local_3dc != 0) break;
            }
            FileSystemUtils::Path::ParentPath((Path *)local_408,(Path *)&i);
            FileSystemUtils::Path::operator=((Path *)&i,(Path *)local_408);
            FileSystemUtils::Path::~Path((Path *)local_408);
          }
          std::_Rb_tree_iterator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>::
          operator++(&local_300);
          FileSystemUtils::Path::~Path((Path *)&i);
        }
        FileSystemUtils::Path::~Path((Path *)local_2d0);
        std::vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_>::~vector
                  ((vector<FileSystemUtils::Path,_std::allocator<FileSystemUtils::Path>_> *)
                   ((long)&requestedSubPath.m_string.field_2 + 8));
      }
      FileSystemUtils::Path::~Path((Path *)local_1d8);
      FileSystemUtils::Path::~Path((Path *)((long)&foundDir.m_string.field_2 + 8));
    }
    FileSystemUtils::Path::ToOSCanonicalCase(__return_storage_ptr__);
  }
  bVar13 = FileSystemUtils::Path::Exists(__return_storage_ptr__);
  if (pFound != (bool *)0x0) {
    *pFound = bVar13;
  }
  if ((!bVar13) && (this->m_pCompilerLogger != (ICompilerLogger *)0x0)) {
    pIVar1 = this->m_pCompilerLogger;
    pcVar6 = FileSystemUtils::Path::c_str(input);
    (**(code **)(*(long *)pIVar1 + 8))(pIVar1,"Could not find Directory Mapping for: %s\n",pcVar6);
  }
  local_8d = 1;
  local_3dc = 1;
  FileSystemUtils::Path::~Path((Path *)local_80);
  FileSystemUtils::Path::~Path((Path *)((long)&filename.m_string.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

FileSystemUtils::Path RuntimeObjectSystem::FindFile( const FileSystemUtils::Path& input, bool* pFound )
{
    // we want absolute paths, but path might be relative - do a quick check:
    bool bMaybeRelative = true;
    #ifdef _WIN32
        // Note: C:MyDir is actually a relative path but we do not handle these as unlikely to be produced by __FILE__ input
        if( input.m_string.size() >= 1 )
        {
            if( input.m_string[0] == '\\' )
            {
                bMaybeRelative = false;
            }
            else if( input.m_string.size() >= 2 && input.m_string[1] == ':' )
            {
                bMaybeRelative = false;
            }
        }
    #else
        if( input.m_string.size() >= 1 )
        {
            if( input.m_string[0] == '/' )
            {
                bMaybeRelative = false;
            }
        }
    #endif


    FileSystemUtils::Path requestedDirectory = input;
    FileSystemUtils::Path filename;
    FileSystemUtils::Path foundFile = input;
    bool bIsFile = input.HasExtension();
    if( bIsFile )
    {
        requestedDirectory = requestedDirectory.ParentPath();
        filename = input.Filename();
    }

    if( bMaybeRelative )
    {
        // Test with input path as it might be just a file name, leading to empty requestedDirectory
        // which would always match current dir.
        FileSystemUtils::Path checkFromCurrentDir = FileSystemUtils::GetCurrentPath() / input;
        if( checkFromCurrentDir.Exists() )
        {
            foundFile = checkFromCurrentDir;
            requestedDirectory = FileSystemUtils::GetCurrentPath() / requestedDirectory;
        }
    }

    requestedDirectory.ToOSCanonicalCase();
    filename.ToOSCanonicalCase();
    foundFile.ToOSCanonicalCase();

    // Step 1: Try input directory
    if( requestedDirectory.Exists() )
    {
        m_FoundSourceDirectoryMappings[ requestedDirectory ] = requestedDirectory;
    }
    else
    {
        // Step 2: Attempt to find a pre-existing mapping
        bool bFoundMapping = false;
        if( m_FoundSourceDirectoryMappings.size() )
        {
            FileSystemUtils::Path testDir = requestedDirectory;
            FileSystemUtils::Path foundDir;
            unsigned int depth = 0;
            bool bFound = false;
            while( testDir.HasParentPath() )
            {
                TFileMapIterator itrFind = m_FoundSourceDirectoryMappings.find( testDir );
                if( itrFind != m_FoundSourceDirectoryMappings.end() )
                {
                    foundDir = itrFind->second;
                    bFound = true;
                    break;
                }

                testDir = testDir.ParentPath();
                ++depth;
            }

            if( bFound )
            {
                if( depth )
                {
                    // not an exact match
                    FileSystemUtils::Path directory = requestedDirectory;
                    directory.m_string.replace( 0, testDir.m_string.length(), foundDir.m_string );
                    if( directory.Exists() )
                    {
                        foundFile = directory / filename;
                        if( foundFile.Exists() )
                        {
                            m_FoundSourceDirectoryMappings[ requestedDirectory ] = directory;
                            if( m_pCompilerLogger ) {  m_pCompilerLogger->LogInfo( "Found Directory Mapping: %s to %s\n", requestedDirectory.c_str(), directory.c_str() ); }
                            bFoundMapping = true;
                        }
                    }

                }
                else
                {
                    // exact match
                    foundFile = foundDir / filename;
                    bFoundMapping = true;
                }
            }
            
            if( !bFoundMapping )
            {
                // Step 3: Attempt to find a mapping from a known path
                TFileList requestedSubPaths;
                FileSystemUtils::Path requestedSubPath = requestedDirectory;
                while( requestedSubPath.HasParentPath() )
                {
                    requestedSubPaths.push_back( requestedSubPath );
                    requestedSubPath = requestedSubPath.ParentPath();
                }

                TFileMapIterator itr = m_FoundSourceDirectoryMappings.begin();
                while( ( itr != m_FoundSourceDirectoryMappings.end() ) && !bFoundMapping )
                {
                    FileSystemUtils::Path existingPath = itr->second;
                    while( ( existingPath.HasParentPath() ) && !bFoundMapping )
                    {
                        // check all potentials
                        for( size_t i=0; i<requestedSubPaths.size(); ++i )
                        {
                            FileSystemUtils::Path toCheck = existingPath / requestedSubPaths[i].Filename();
                            if( toCheck.Exists() )
                            {
                                // potential mapping
                                FileSystemUtils::Path directory = requestedDirectory;
                                directory.m_string.replace( 0, requestedSubPaths[i].m_string.length(), toCheck.m_string );
                                if( directory.Exists() )
                                {
                                    foundFile = directory / filename;
                                    if( foundFile.Exists() )
                                    {
                                        m_FoundSourceDirectoryMappings[ requestedDirectory ] = directory;
                                        if( m_pCompilerLogger ) {  m_pCompilerLogger->LogInfo( "Found Directory Mapping: %s to %s\n", requestedDirectory.c_str(), directory.c_str() ); }
                                        bFoundMapping = true;
                                        break;
                                    }
                                }
                            }
                        }
                        existingPath = existingPath.ParentPath();
                    }
                    ++itr;
                }
            }
        }

        foundFile.ToOSCanonicalCase();
    }

    bool bFound = foundFile.Exists();
    if( pFound )
    {
        *pFound = bFound;
    }
    if( !bFound )
    {
        if( m_pCompilerLogger ) {  m_pCompilerLogger->LogWarning( "Could not find Directory Mapping for: %s\n", input.c_str() ); }
    }
    return foundFile;
}